

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-s-parser.cpp
# Opt level: O0

size_t __thiscall
wasm::SExpressionWasmBuilder::parseFunctionNames
          (SExpressionWasmBuilder *this,Element *s,Name *name,Name *exportName)

{
  ulong uVar1;
  bool bVar2;
  size_t sVar3;
  Element *pEVar4;
  IString IVar5;
  bool local_a9;
  Name local_98;
  Element *local_88;
  size_t local_80;
  Element *local_78;
  Element *inner;
  Name local_60;
  string_view local_50;
  Name local_40;
  ulong local_30;
  size_t i;
  Name *exportName_local;
  Name *name_local;
  Element *s_local;
  SExpressionWasmBuilder *this_local;
  
  local_30 = 1;
  i = (size_t)exportName;
  exportName_local = name;
  name_local = (Name *)s;
  s_local = (Element *)this;
  while( true ) {
    uVar1 = local_30;
    sVar3 = Element::size((Element *)name_local);
    local_a9 = false;
    if ((uVar1 < sVar3) && (local_a9 = false, local_30 < 3)) {
      pEVar4 = Element::operator[]((Element *)name_local,(uint)local_30);
      local_a9 = Element::isStr(pEVar4);
    }
    if (local_a9 == false) break;
    pEVar4 = Element::operator[]((Element *)name_local,(uint)local_30);
    bVar2 = Element::quoted(pEVar4);
    if (bVar2) {
      pEVar4 = Element::operator[]((Element *)name_local,(uint)local_30);
      local_50 = (string_view)Element::str(pEVar4);
      wasm::Name::Name(&local_40,(IString)local_50);
      wasm::Name::operator=((Name *)i,&local_40);
    }
    else {
      pEVar4 = Element::operator[]((Element *)name_local,(uint)local_30);
      bVar2 = Element::dollared(pEVar4);
      if (!bVar2) break;
      pEVar4 = Element::operator[]((Element *)name_local,(uint)local_30);
      _inner = (string_view)Element::str(pEVar4);
      wasm::Name::Name(&local_60,(IString)_inner);
      wasm::Name::operator=(exportName_local,&local_60);
    }
    local_30 = local_30 + 1;
  }
  uVar1 = local_30;
  sVar3 = Element::size((Element *)name_local);
  if (uVar1 < sVar3) {
    pEVar4 = Element::operator[]((Element *)name_local,(uint)local_30);
    bVar2 = Element::isList(pEVar4);
    if (bVar2) {
      local_78 = Element::operator[]((Element *)name_local,(uint)local_30);
      local_88 = EXPORT;
      local_80 = DAT_027e57c0;
      IVar5.str._M_str = &EXPORT->isList_;
      IVar5.str._M_len = DAT_027e57c0;
      bVar2 = elementStartsWith((wasm *)local_78,EXPORT,IVar5);
      if (bVar2) {
        pEVar4 = Element::operator[](local_78,1);
        IVar5 = Element::str(pEVar4);
        wasm::Name::Name(&local_98,IVar5);
        wasm::Name::operator=((Name *)i,&local_98);
        local_30 = local_30 + 1;
      }
    }
  }
  return local_30;
}

Assistant:

size_t SExpressionWasmBuilder::parseFunctionNames(Element& s,
                                                  Name& name,
                                                  Name& exportName) {
  size_t i = 1;
  while (i < s.size() && i < 3 && s[i]->isStr()) {
    if (s[i]->quoted()) {
      // an export name
      exportName = s[i]->str();
      i++;
    } else if (s[i]->dollared()) {
      name = s[i]->str();
      i++;
    } else {
      break;
    }
  }
  if (i < s.size() && s[i]->isList()) {
    auto& inner = *s[i];
    if (elementStartsWith(inner, EXPORT)) {
      exportName = inner[1]->str();
      i++;
    }
  }
#if 0
  if (exportName.is() && !name.is()) {
    name = exportName; // useful for debugging
  }
#endif
  return i;
}